

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O1

void nni_sleep_cancel(nng_aio *aio,void *arg,int rv)

{
  nni_aio_expire_q *mtx;
  
  mtx = aio->a_expire_q;
  nni_mtx_lock(&mtx->eq_mtx);
  if (aio->a_sleep != false) {
    aio->a_sleep = false;
    nni_list_node_remove(&aio->a_expire_node);
    nni_mtx_unlock(&mtx->eq_mtx);
    nni_aio_finish_impl(aio,rv,0,(nni_msg *)0x0,false);
    return;
  }
  nni_mtx_unlock(&mtx->eq_mtx);
  return;
}

Assistant:

static void
nni_sleep_cancel(nng_aio *aio, void *arg, int rv)
{
	NNI_ARG_UNUSED(arg);
	nni_aio_expire_q *eq = aio->a_expire_q;

	nni_mtx_lock(&eq->eq_mtx);
	if (!aio->a_sleep) {
		nni_mtx_unlock(&eq->eq_mtx);
		return;
	}

	aio->a_sleep = false;
	nni_aio_expire_rm(aio);
	nni_mtx_unlock(&eq->eq_mtx);

	nni_aio_finish_error(aio, rv);
}